

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLowering.cpp
# Opt level: O2

void __thiscall wasm::StringLowering::makeImports(StringLowering *this,Module *module)

{
  pointer puVar1;
  Expression *pEVar2;
  Global *pGVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  string *defaultValue;
  pointer puVar7;
  uint __val;
  string_view str_00;
  string_view str_01;
  undefined1 local_6a0 [8];
  stringstream json;
  ostream local_690 [376];
  undefined1 auStack_518 [8];
  __string_type jsonString;
  undefined1 local_390 [8];
  stringstream utf8;
  ostream local_380 [16];
  pointer local_370;
  pointer pcStack_368;
  pointer local_360;
  undefined1 auStack_208 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  undefined1 auStack_80 [8];
  Name stringConstsModule;
  undefined1 auStack_68 [8];
  vector<char,_std::allocator<char>_> vec;
  allocator<char> local_31;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_390,"string-constants-module",(allocator<char> *)auStack_208);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_518,WasmStringConstsModule,(allocator<char> *)auStack_68);
  defaultValue = (string *)auStack_518;
  Pass::getArgumentOrDefault((string *)local_6a0,(Pass *)this,(string *)local_390,defaultValue);
  IString::IString((IString *)auStack_80,(string *)local_6a0);
  std::__cxx11::string::~string((string *)local_6a0);
  std::__cxx11::string::~string((string *)auStack_518);
  std::__cxx11::string::~string((string *)local_390);
  std::__cxx11::stringstream::stringstream((stringstream *)local_6a0);
  puVar7 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __val = 0;
  bVar5 = true;
  stringConstsModule.super_IString.str._M_str = (char *)module;
  do {
    if (puVar7 == puVar1) {
      std::__cxx11::stringbuf::str();
      pcVar4 = stringConstsModule.super_IString.str._M_str;
      if (jsonString._M_dataplus._M_p != (pointer)0x0) {
        if (this->assertUTF8 == true) {
          __assert_fail("!assertUTF8",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/StringLowering.cpp"
                        ,0x117,"void wasm::StringLowering::makeImports(Module *)");
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_390,'[',
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_518);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_390,']');
        std::__cxx11::string::~string((string *)local_390);
        std::vector<char,std::allocator<char>>::
        vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((vector<char,std::allocator<char>> *)auStack_68,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )auStack_208,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(str._M_dataplus._M_p + (long)auStack_208),(allocator_type *)local_390);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_390,"string.consts",&local_31);
        local_370 = (pointer)auStack_68;
        pcStack_368 = vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_360 = vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        auStack_68 = (undefined1  [8])0x0;
        vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::
        emplace_back<wasm::CustomSection>
                  ((vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *)
                   (pcVar4 + 0xd0),(CustomSection *)local_390);
        CustomSection::~CustomSection((CustomSection *)local_390);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)auStack_68);
        std::__cxx11::string::~string((string *)auStack_208);
      }
      std::__cxx11::string::~string((string *)auStack_518);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_6a0);
      return;
    }
    pEVar2 = ((puVar7->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
              ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
              super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init;
    if ((pEVar2 != (Expression *)0x0) && (pEVar2->_id == StringConstId)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_390);
      if (this->useMagicImports == true) {
        bVar6 = String::convertUTF16ToUTF8(local_380,*(string_view *)(pEVar2 + 1));
        if (!bVar6) goto LAB_00b3cafe;
        pGVar3 = (puVar7->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        *(undefined1 (*) [8])&(pGVar3->super_Importable).module.super_IString.str = auStack_80;
        *(size_t *)((long)&(pGVar3->super_Importable).module + 8) =
             stringConstsModule.super_IString.str._M_len;
        std::__cxx11::stringbuf::str();
        IString::IString((IString *)auStack_208,(string *)auStack_518);
        pGVar3 = (puVar7->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        *(undefined1 (*) [8])&(pGVar3->super_Importable).base.super_IString.str = auStack_208;
        *(pointer *)((long)&(pGVar3->super_Importable).base + 8) = str._M_dataplus._M_p;
        std::__cxx11::string::~string((string *)auStack_518);
      }
      else {
LAB_00b3cafe:
        if (this->assertUTF8 == true) {
          std::__cxx11::stringstream::stringstream((stringstream *)auStack_518);
          std::__cxx11::stringbuf::str();
          str_01._M_str = (char *)defaultValue;
          str_01._M_len = (size_t)auStack_208;
          String::printEscaped
                    ((String *)&jsonString._M_string_length,(ostream *)str._M_dataplus._M_p,str_01);
          std::__cxx11::string::~string((string *)auStack_208);
          Fatal::Fatal((Fatal *)auStack_208);
          std::operator<<((ostream *)&str._M_string_length,"Cannot lower non-UTF-16 string ");
          std::__cxx11::stringbuf::str();
          std::operator<<((ostream *)&str._M_string_length,(string *)auStack_68);
          local_31 = (allocator<char>)0xa;
          Fatal::operator<<((Fatal *)auStack_208,(char *)&local_31);
          std::__cxx11::string::~string((string *)auStack_68);
          Fatal::~Fatal((Fatal *)auStack_208);
        }
        Name::Name((Name *)auStack_518,"string.const");
        pGVar3 = (puVar7->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        *(undefined1 (*) [8])&(pGVar3->super_Importable).module.super_IString.str = auStack_518;
        *(pointer *)((long)&(pGVar3->super_Importable).module + 8) = jsonString._M_dataplus._M_p;
        std::__cxx11::to_string((string *)auStack_518,__val);
        IString::IString((IString *)auStack_208,(string *)auStack_518);
        pGVar3 = (puVar7->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        *(undefined1 (*) [8])&(pGVar3->super_Importable).base.super_IString.str = auStack_208;
        *(pointer *)((long)&(pGVar3->super_Importable).base + 8) = str._M_dataplus._M_p;
        std::__cxx11::string::~string((string *)auStack_518);
        if (!bVar5) {
          std::operator<<(local_690,',');
        }
        str_00._M_str = (char *)defaultValue;
        str_00._M_len = pEVar2[1].type.id;
        String::printEscapedJSON((String *)local_690,*(ostream **)(pEVar2 + 1),str_00);
        __val = __val + 1;
        bVar5 = false;
      }
      ((puVar7->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
       super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init = (Expression *)0x0;
      std::__cxx11::stringstream::~stringstream((stringstream *)local_390);
    }
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

void makeImports(Module* module) {
    Name stringConstsModule =
      getArgumentOrDefault("string-constants-module", WasmStringConstsModule);
    Index jsonImportIndex = 0;
    std::stringstream json;
    bool first = true;
    for (auto& global : module->globals) {
      if (global->init) {
        if (auto* c = global->init->dynCast<StringConst>()) {
          std::stringstream utf8;
          if (useMagicImports &&
              String::convertUTF16ToUTF8(utf8, c->string.str)) {
            global->module = stringConstsModule;
            global->base = Name(utf8.str());
          } else {
            if (assertUTF8) {
              std::stringstream escaped;
              String::printEscaped(escaped, utf8.str());
              Fatal() << "Cannot lower non-UTF-16 string " << escaped.str()
                      << '\n';
            }
            global->module = "string.const";
            global->base = std::to_string(jsonImportIndex);
            if (first) {
              first = false;
            } else {
              json << ',';
            }
            String::printEscapedJSON(json, c->string.str);
            jsonImportIndex++;
          }
          global->init = nullptr;
        }
      }
    }

    auto jsonString = json.str();
    if (!jsonString.empty()) {
      // If we are asserting UTF8, then we shouldn't be generating any JSON.
      assert(!assertUTF8);
      // Add a custom section with the JSON.
      auto str = '[' + jsonString + ']';
      auto vec = std::vector<char>(str.begin(), str.end());
      module->customSections.emplace_back(
        CustomSection{"string.consts", std::move(vec)});
    }
  }